

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::
SmallVectorBase<std::pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef>_>
::reallocateTo(SmallVectorBase<std::pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef>_>
               *this,size_type newCapacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer p;
  size_type sVar3;
  undefined8 uVar4;
  pointer ppVar5;
  long lVar6;
  
  ppVar5 = (pointer)operator_new(newCapacity << 4);
  p = this->data_;
  sVar3 = this->len;
  if (sVar3 != 0) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(p->first).pip.value + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(ppVar5->first).pip.value + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
    } while (sVar3 << 4 != lVar6);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->cap = newCapacity;
  this->data_ = ppVar5;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }